

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mktime.c
# Opt level: O0

int main(void)

{
  time_t tVar1;
  time_t t;
  tm time;
  
  time.__tm_zone._4_4_ = 0;
  t._0_4_ = 0x34;
  t._4_4_ = 0x2d;
  time.tm_sec = 0x15;
  time.tm_min = 0xd;
  time.tm_hour = 0xb;
  time.tm_mday = 1;
  time.tm_mon = 0;
  time.tm_year = 0;
  time.tm_wday = -1;
  tVar1 = mktime((tm *)&t);
  if (tVar1 != -0x80000000) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/mktime.c, line %d - %s\n"
           ,0x2c,"t == -2147483648l");
  }
  t._0_4_ = 7;
  t._4_4_ = 0xe;
  time.tm_sec = 4;
  time.tm_min = 0x13;
  time.tm_hour = 0;
  time.tm_mday = 0x8a;
  time.tm_mon = 0;
  time.tm_year = 0;
  time.tm_wday = -1;
  tVar1 = mktime((tm *)&t);
  if (tVar1 != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/mktime.c, line %d - %s\n"
           ,0x30,"t == 2147483647l");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    /* System Clock DST */
    struct tm time;
    time_t t;

    MKTIME( time, 52, 45, 21, 13, 11, 1, 0, 0 );
    t = mktime( &time );
    TESTCASE( t == -2147483648l );

    MKTIME( time, 7, 14, 4, 19, 0, 138, 0, 0 );
    t = mktime( &time );
    TESTCASE( t == 2147483647l );

    return TEST_RESULTS;
}